

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O3

vm_dynfunc_ext * vm_dynfunc_ext::alloc_ext(CVmDynamicFunc *self,size_t bytecode_len,int obj_ref_cnt)

{
  int iVar1;
  undefined4 extraout_var;
  vm_dynfunc_ext *pvVar2;
  
  iVar1 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])
                    (G_mem_X->varheap_,bytecode_len + 0x30 + (long)obj_ref_cnt * 4,self);
  pvVar2 = (vm_dynfunc_ext *)CONCAT44(extraout_var,iVar1);
  pvVar2->obj_ref_cnt = obj_ref_cnt;
  pvVar2->bytecode_len = bytecode_len;
  (pvVar2->src).typ = VM_NIL;
  (pvVar2->method_ctx).typ = VM_NIL;
  return pvVar2;
}

Assistant:

vm_dynfunc_ext *vm_dynfunc_ext::alloc_ext(
    VMG_ CVmDynamicFunc *self, size_t bytecode_len, int obj_ref_cnt)
{
    /* 
     *   Calculate how much space we need: we need the base structure, plus
     *   space for the object references, plus the dynamic object header, and
     *   the byte code array.  
     */
    size_t siz = sizeof(vm_dynfunc_ext)
                 + (obj_ref_cnt - 1)*sizeof_field(vm_dynfunc_ext, obj_refs[0])
                 + VMCO_PREFIX_LENGTH
                 + bytecode_len;
    
    /* allocate the memory */
    vm_dynfunc_ext *ext = (vm_dynfunc_ext *)G_mem->get_var_heap()->alloc_mem(
        siz, self);
    
    /* remember the sizes */
    ext->obj_ref_cnt = obj_ref_cnt;
    ext->bytecode_len = bytecode_len;

    /* we don't have any source text yet */
    ext->src.set_nil();

    /* we don't have a method context object yet */
    ext->method_ctx.set_nil();

    /* return the new extension */
    return ext;
}